

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint64_t hash_get_block_64(uint64_t *p,int i)

{
  uint64_t ret;
  int i_local;
  uint64_t *p_local;
  uint64_t local_8;
  
  if (((ulong)p & 7) == 0) {
    local_8 = p[i];
  }
  else {
    local_8 = p[i];
  }
  return local_8;
}

Assistant:

static inline uint64_t
hash_get_block_64(const uint64_t *p, int i) {
	/* Handle unaligned read. */
	if (unlikely((uintptr_t)p & (sizeof(uint64_t)-1)) != 0) {
		uint64_t ret;

		memcpy(&ret, (uint8_t *)(p + i), sizeof(uint64_t));
		return ret;
	}

	return p[i];
}